

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxAddSub::Resolve(FxAddSub *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FxConstant *this_00;
  int val;
  double dVar5;
  ExpVal local_38;
  double local_28;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved == false) {
    (this->super_FxBinary).super_FxExpression.isresolved = true;
    bVar1 = FxBinary::ResolveLR(&this->super_FxBinary,ctx,false);
    if (bVar1) {
      bVar1 = FxExpression::IsNumeric((FxExpression *)this);
      if (bVar1) {
        iVar2 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if (((char)iVar2 != '\0') &&
           (iVar2 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (char)iVar2 != '\0')
           ) {
          iVar2 = (*(((this->super_FxBinary).super_FxExpression.ValueType)->super_DObject).
                    _vptr_DObject[0x12])();
          if (iVar2 == 1) {
            ExpVal::ExpVal(&local_38,(ExpVal *)((this->super_FxBinary).left + 1));
            dVar5 = ExpVal::GetFloat(&local_38);
            ExpVal::~ExpVal(&local_38);
            ExpVal::ExpVal(&local_38,(ExpVal *)((this->super_FxBinary).right + 1));
            local_28 = ExpVal::GetFloat(&local_38);
            ExpVal::~ExpVal(&local_38);
            iVar2 = *(int *)&(this->super_FxBinary).super_FxExpression.field_0x34;
            if (iVar2 == 0x2b) {
              dVar5 = dVar5 + local_28;
            }
            else if (iVar2 == 0x2d) {
              dVar5 = dVar5 - local_28;
            }
            else {
              dVar5 = 0.0;
            }
            this_00 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (this_00,dVar5,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
          }
          else {
            ExpVal::ExpVal(&local_38,(ExpVal *)((this->super_FxBinary).left + 1));
            iVar3 = ExpVal::GetInt(&local_38);
            ExpVal::~ExpVal(&local_38);
            ExpVal::ExpVal(&local_38,(ExpVal *)((this->super_FxBinary).right + 1));
            iVar4 = ExpVal::GetInt(&local_38);
            ExpVal::~ExpVal(&local_38);
            iVar2 = *(int *)&(this->super_FxBinary).super_FxExpression.field_0x34;
            val = 0;
            if (iVar2 == 0x2d) {
              val = iVar3 - iVar4;
            }
            if (iVar2 == 0x2b) {
              val = iVar4 + iVar3;
            }
            this_00 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (this_00,val,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
          }
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
          return &this_00->super_FxExpression;
        }
        FxBinary::Promote(&this->super_FxBinary,ctx);
        return (FxExpression *)this;
      }
      FScriptPosition::Message
                (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,"Numeric type expected"
                );
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
    }
    this = (FxAddSub *)0x0;
  }
  return (FxExpression *)this;
}

Assistant:

FxExpression *FxAddSub::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (!ResolveLR(ctx, true)) return NULL;

	if (!IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
	else if (left->isConstant() && right->isConstant())
	{
		if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v;
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;
		}
		else
		{
			int v;
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;

		}
	}
	Promote(ctx);
	return this;
}